

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_1::LineLoopCase::generateLines
          (LineLoopCase *this,int iteration,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *outData,
          vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
          *outLines)

{
  ostringstream *poVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  pointer pVVar8;
  pointer pSVar9;
  ulong uVar10;
  undefined8 uVar11;
  long lVar12;
  long lVar13;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  uVar10 = (ulong)(uint)iteration;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(outData,4);
  if ((uint)iteration < 3) {
    fVar2 = *(float *)(&DAT_01c07600 + uVar10 * 4);
    fVar3 = *(float *)(&DAT_01c0760c + uVar10 * 4);
    fVar4 = *(float *)(&DAT_01c07618 + uVar10 * 4);
    fVar5 = *(float *)(&DAT_01c07624 + uVar10 * 4);
    fVar6 = *(float *)(&DAT_01c07630 + uVar10 * 4);
    fVar7 = *(float *)(&DAT_01c0763c + uVar10 * 4);
    pVVar8 = (outData->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar8->m_data[0] = *(float *)(&DAT_01c075f4 + uVar10 * 4);
    pVVar8->m_data[1] = fVar2;
    pVVar8->m_data[2] = 0.0;
    pVVar8->m_data[3] = 1.0;
    pVVar8 = (outData->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar8[1].m_data[0] = fVar3;
    pVVar8[1].m_data[1] = fVar4;
    pVVar8[1].m_data[2] = 0.0;
    pVVar8[1].m_data[3] = 1.0;
    pVVar8 = (outData->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar8[2].m_data[0] = fVar5;
    pVVar8[2].m_data[1] = fVar6;
    pVVar8[2].m_data[2] = 0.0;
    pVVar8[2].m_data[3] = 1.0;
    pVVar8 = (outData->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar8[3].m_data[0] = fVar7;
    pVVar8[3].m_data[1] = 0.2;
    pVVar8[3].m_data[2] = 0.0;
    pVVar8[3].m_data[3] = 1.0;
  }
  std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::resize
            (outLines,4);
  pVVar8 = (outData->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar9 = (outLines->
           super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = *(undefined8 *)(pVVar8->m_data + 2);
  *(undefined8 *)pSVar9->positions[0].m_data = *(undefined8 *)pVVar8->m_data;
  *(undefined8 *)(pSVar9->positions[0].m_data + 2) = uVar11;
  pVVar8 = (outData->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar9 = (outLines->
           super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = *(undefined8 *)(pVVar8[1].m_data + 2);
  *(undefined8 *)pSVar9->positions[1].m_data = *(undefined8 *)pVVar8[1].m_data;
  *(undefined8 *)(pSVar9->positions[1].m_data + 2) = uVar11;
  pVVar8 = (outData->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar9 = (outLines->
           super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = *(undefined8 *)(pVVar8[1].m_data + 2);
  *(undefined8 *)pSVar9[1].positions[0].m_data = *(undefined8 *)pVVar8[1].m_data;
  *(undefined8 *)(pSVar9[1].positions[0].m_data + 2) = uVar11;
  pVVar8 = (outData->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar9 = (outLines->
           super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = *(undefined8 *)(pVVar8[2].m_data + 2);
  *(undefined8 *)pSVar9[1].positions[1].m_data = *(undefined8 *)pVVar8[2].m_data;
  *(undefined8 *)(pSVar9[1].positions[1].m_data + 2) = uVar11;
  pVVar8 = (outData->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar9 = (outLines->
           super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = *(undefined8 *)(pVVar8[2].m_data + 2);
  *(undefined8 *)pSVar9[2].positions[0].m_data = *(undefined8 *)pVVar8[2].m_data;
  *(undefined8 *)(pSVar9[2].positions[0].m_data + 2) = uVar11;
  pVVar8 = (outData->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar9 = (outLines->
           super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = *(undefined8 *)(pVVar8[3].m_data + 2);
  *(undefined8 *)pSVar9[2].positions[1].m_data = *(undefined8 *)pVVar8[3].m_data;
  *(undefined8 *)(pSVar9[2].positions[1].m_data + 2) = uVar11;
  pVVar8 = (outData->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar9 = (outLines->
           super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = *(undefined8 *)(pVVar8[3].m_data + 2);
  *(undefined8 *)pSVar9[3].positions[0].m_data = *(undefined8 *)pVVar8[3].m_data;
  *(undefined8 *)(pSVar9[3].positions[0].m_data + 2) = uVar11;
  pVVar8 = (outData->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar9 = (outLines->
           super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = *(undefined8 *)(pVVar8->m_data + 2);
  *(undefined8 *)pSVar9[3].positions[1].m_data = *(undefined8 *)pVVar8->m_data;
  *(undefined8 *)(pSVar9[3].positions[1].m_data + 2) = uVar11;
  local_1b0._0_8_ =
       ((this->super_BaseLineCase).super_BaseRenderingCase.super_TestCase.super_TestCase.
        super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Rendering line loop, width = ",0x1d);
  std::ostream::_M_insert<double>
            ((double)(this->super_BaseLineCase).super_BaseRenderingCase.m_lineWidth);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," vertices.",10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (0 < (int)((ulong)((long)(outData->
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(outData->
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 4)) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    lVar13 = 0;
    lVar12 = 0;
    do {
      local_1b0._0_8_ =
           ((this->super_BaseLineCase).super_BaseRenderingCase.super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
      tcu::operator<<((ostream *)poVar1,
                      (Vector<float,_4> *)
                      ((long)((outData->
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0x10;
    } while (lVar12 < (int)((ulong)((long)(outData->
                                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(outData->
                                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 4));
  }
  return;
}

Assistant:

void LineLoopCase::generateLines (int iteration, std::vector<tcu::Vec4>& outData, std::vector<LineSceneSpec::SceneLine>& outLines)
{
	outData.resize(4);

	switch (iteration)
	{
		case 0:
			// \note: these values are chosen arbitrarily
			outData[0] = tcu::Vec4( 0.01f,  0.0f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4( 0.5f,   0.2f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4( 0.46f,  0.3f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(-0.5f,   0.2f, 0.0f, 1.0f);
			break;

		case 1:
			outData[0] = tcu::Vec4(-0.499f, 0.128f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4(-0.501f,  -0.3f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4(  0.11f,  -0.2f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(  0.11f,   0.2f, 0.0f, 1.0f);
			break;

		case 2:
			outData[0] = tcu::Vec4( -0.9f, -0.3f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4(  1.1f, -0.9f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4(  0.7f, -0.1f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4( 0.11f,  0.2f, 0.0f, 1.0f);
			break;
	}

	outLines.resize(4);
	outLines[0].positions[0] = outData[0];
	outLines[0].positions[1] = outData[1];
	outLines[1].positions[0] = outData[1];
	outLines[1].positions[1] = outData[2];
	outLines[2].positions[0] = outData[2];
	outLines[2].positions[1] = outData[3];
	outLines[3].positions[0] = outData[3];
	outLines[3].positions[1] = outData[0];

	// log
	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering line loop, width = " << m_lineWidth << ", " << outData.size() << " vertices." << tcu::TestLog::EndMessage;
	for (int vtxNdx = 0; vtxNdx < (int)outData.size(); ++vtxNdx)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "\t" << outData[vtxNdx]
			<< tcu::TestLog::EndMessage;
	}
}